

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnbitset * rnn_findbitset(rnndb *db,char *name)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x38) <= local_1c) {
      return (rnnbitset *)0x0;
    }
    iVar1 = strcmp((char *)**(undefined8 **)(*(long *)(in_RDI + 0x30) + (long)local_1c * 8),in_RSI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return *(rnnbitset **)(*(long *)(in_RDI + 0x30) + (long)local_1c * 8);
}

Assistant:

struct rnnbitset *rnn_findbitset (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->bitsetsnum; i++)
		if (!strcmp(db->bitsets[i]->name, name))
			return db->bitsets[i];
	return 0;
}